

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::Matcher<const_solitaire::geometry::Area_&>::Matcher
          (Matcher<const_solitaire::geometry::Area_&> *this,Area *value)

{
  MatcherBase<const_solitaire::geometry::Area_&> local_40;
  Position local_28;
  Size SStack_20;
  
  (this->super_MatcherBase<const_solitaire::geometry::Area_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_solitaire::geometry::Area_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00326000;
  local_28 = value->position;
  SStack_20 = value->size;
  local_40.vtable_ =
       (VTable *)
       internal::MatcherBase<solitaire::geometry::Area_const&>::
       GetVTable<testing::internal::MatcherBase<solitaire::geometry::Area_const&>::ValuePolicy<testing::internal::EqMatcher<solitaire::geometry::Area>,false>>()
       ::kVTable;
  local_40.buffer_.ptr = operator_new(0x14);
  ((local_40.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(Position *)(local_40.buffer_.i + 4) = local_28;
  *(Size *)(local_40.buffer_.i + 0xc) = SStack_20;
  local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00326000;
  internal::MatcherBase<const_solitaire::geometry::Area_&>::operator=
            (&this->super_MatcherBase<const_solitaire::geometry::Area_&>,&local_40);
  internal::MatcherBase<const_solitaire::geometry::Area_&>::~MatcherBase(&local_40);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }